

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int64 __thiscall Bstrlib::String::parseInt(String *this,int base,int *endPos)

{
  uchar uVar1;
  char *local_98;
  int local_7c;
  char *pcStack_78;
  int digit;
  char *charPos;
  int64 ret;
  char BASEText [17];
  char local_48 [8];
  char baseText [17];
  bool negative;
  char *text;
  int *endPos_local;
  int base_local;
  String *this_local;
  
  unique0x00012000 = (this->super_tagbstring).data;
  if ((this->super_tagbstring).slen == 0) {
    if (endPos != (int *)0x0) {
      *endPos = 0;
    }
    return 0;
  }
  baseText[0xf] = *unique0x00012000 == '-';
  register0x00000000 = unique0x00012000 + (int)(uint)(byte)baseText[0xf];
  builtin_strncpy(local_48,"01234567",8);
  builtin_strncpy(baseText,"89abcdef",9);
  ret._0_1_ = '0';
  ret._1_1_ = '1';
  ret._2_1_ = '2';
  ret._3_1_ = '3';
  ret._4_1_ = '4';
  ret._5_1_ = '5';
  ret._6_1_ = '6';
  ret._7_1_ = '7';
  builtin_strncpy(BASEText,"89ABCDEF",9);
  endPos_local._4_4_ = base;
  if (base != 0) goto LAB_0011159c;
  if (*register0x00000000 != '0') {
    endPos_local._4_4_ = 10;
    goto LAB_0011159c;
  }
  uVar1 = register0x00000000[1];
  if (uVar1 == 'B') {
LAB_00111570:
    endPos_local._4_4_ = 2;
    register0x00000000 = register0x00000000 + 2;
  }
  else {
    if (uVar1 != 'X') {
      if (uVar1 == 'b') goto LAB_00111570;
      if (uVar1 != 'x') {
        endPos_local._4_4_ = 8;
        register0x00000000 = register0x00000000 + 1;
        goto LAB_0011159c;
      }
    }
    endPos_local._4_4_ = 0x10;
    register0x00000000 = register0x00000000 + 2;
  }
LAB_0011159c:
  charPos = (char *)0x0;
  for (; stack0xffffffffffffffd0 != (uchar *)0x0; register0x00000000 = stack0xffffffffffffffd0 + 1)
  {
    pcStack_78 = strchr(local_48,(int)(char)*stack0xffffffffffffffd0);
    local_7c = (int)pcStack_78 - (int)local_48;
    if ((pcStack_78 == (char *)0x0) && (10 < endPos_local._4_4_)) {
      pcStack_78 = strchr((char *)&ret,(int)(char)*stack0xffffffffffffffd0);
      local_7c = (int)pcStack_78 - (int)&ret;
    }
    if ((pcStack_78 == (char *)0x0) || (endPos_local._4_4_ <= local_7c)) break;
    charPos = (char *)((long)charPos * (long)endPos_local._4_4_ + (long)local_7c);
  }
  if (endPos != (int *)0x0) {
    *endPos = (int)stack0xffffffffffffffd0 - (int)(this->super_tagbstring).data;
  }
  if ((baseText[0xf] & 1U) == 0) {
    local_98 = charPos;
  }
  else {
    local_98 = (char *)-(long)charPos;
  }
  return (int64)local_98;
}

Assistant:

int64 String::parseInt(int base, int * endPos) const
    {
        const char * text = (const char*)data;
        if (!slen) { if (endPos) *endPos = 0; return 0; }
        bool negative = text[0] == '-';
        text += (int)negative;
        const char baseText[] = "0123456789abcdef", BASEText[] = "0123456789ABCDEF";

        // Check the current base, if auto detection is activated
        if (!base)
        {
            if (text[0] != '0') base = 10;
            else switch(text[1])
            {
            case 'X': case 'x': base = 16; text += 2; break;
            case 'B': case 'b': base = 2; text += 2; break;
            default: base = 8; text += 1; break;
            }
        }
        // Let's start conversion
        int64 ret = 0;
        while (text)
        {
            const char * charPos = strchr(baseText, *text);
            int digit = (int)(charPos - baseText);
            if (charPos == NULL && base > 10) { charPos = strchr(BASEText, *text); digit = (int)(charPos - BASEText); }
            if (charPos == NULL) break;
            if (digit >= base) break;
            ret = ret * base + digit;
            text++;
        }
        if (endPos) *endPos = (int)(text - (const char*)data);
        return negative ? -ret : ret;
    }